

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::initialiseInstance(HEkkPrimal *this)

{
  HighsInt size_;
  int iVar1;
  HEkk *pHVar2;
  HighsOptions *pHVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  pHVar2 = this->ekk_instance_;
  this->analysis = &pHVar2->analysis_;
  iVar5 = (pHVar2->lp_).num_col_;
  this->num_col = iVar5;
  size_ = (pHVar2->lp_).num_row_;
  this->num_row = size_;
  this->num_tot = iVar5 + size_;
  HVectorBase<double>::setup(&this->col_aq,size_);
  HVectorBase<double>::setup(&this->row_ep,this->num_row);
  HVectorBase<double>::setup(&this->row_ap,this->num_col);
  HVectorBase<double>::setup(&this->col_basic_feasibility_change,this->num_row);
  HVectorBase<double>::setup(&this->row_basic_feasibility_change,this->num_col);
  HVectorBase<double>::setup(&this->col_steepest_edge,this->num_row);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (&this->ph1SorterR,(long)this->num_row);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (&this->ph1SorterT,(long)this->num_row);
  this->num_free_col = 0;
  uVar6 = 0;
  uVar4 = (ulong)(uint)this->num_tot;
  if (this->num_tot < 1) {
    uVar4 = uVar6;
  }
  pHVar2 = this->ekk_instance_;
  iVar5 = 0;
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    if (((pHVar2->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6] <= -INFINITY) &&
       (INFINITY <=
        (pHVar2->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6])) {
      iVar5 = iVar5 + 1;
      this->num_free_col = iVar5;
    }
  }
  iVar1 = (pHVar2->options_->super_HighsOptionsStruct).highs_debug_level;
  if (iVar5 != 0) {
    highsLogDev(&(pHVar2->options_->super_HighsOptionsStruct).log_options,kInfo,
                "HEkkPrimal:: LP has %d free columns\n");
    pHVar3 = this->ekk_instance_->options_;
    HSet::setup(&this->nonbasic_free_col_set,this->num_free_col,this->num_tot,
                (pHVar3->super_HighsOptionsStruct).output_flag,
                (pHVar3->super_HighsOptionsStruct).log_options.log_stream,1 < iVar1,true);
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->hyper_chuzc_candidate,(long)this->max_num_hyper_chuzc_candidates + 1);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->hyper_chuzc_measure,(long)this->max_num_hyper_chuzc_candidates + 1);
  pHVar3 = this->ekk_instance_->options_;
  HSet::setup(&this->hyper_chuzc_candidate_set,this->max_num_hyper_chuzc_candidates,this->num_tot,
              (pHVar3->super_HighsOptionsStruct).output_flag,
              (pHVar3->super_HighsOptionsStruct).log_options.log_stream,1 < iVar1,true);
  return;
}

Assistant:

void HEkkPrimal::initialiseInstance() {
  // Called in constructor for HEkkPrimal class
  analysis = &ekk_instance_.analysis_;

  num_col = ekk_instance_.lp_.num_col_;
  num_row = ekk_instance_.lp_.num_row_;
  num_tot = num_col + num_row;

  // Setup local vectors
  col_aq.setup(num_row);
  row_ep.setup(num_row);
  row_ap.setup(num_col);
  col_basic_feasibility_change.setup(num_row);
  row_basic_feasibility_change.setup(num_col);
  col_steepest_edge.setup(num_row);

  ph1SorterR.reserve(num_row);
  ph1SorterT.reserve(num_row);

  num_free_col = 0;
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    if (ekk_instance_.info_.workLower_[iCol] == -kHighsInf &&
        ekk_instance_.info_.workUpper_[iCol] == kHighsInf) {
      // Free column
      num_free_col++;
    }
  }
  // Set up the HSet instances, possibly using the internal error reporting and
  // debug option
  const bool debug =
      ekk_instance_.options_->highs_debug_level > kHighsDebugLevelCheap;
  if (num_free_col) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "HEkkPrimal:: LP has %" HIGHSINT_FORMAT " free columns\n",
                num_free_col);
    nonbasic_free_col_set.setup(
        num_free_col, num_tot, ekk_instance_.options_->output_flag,
        ekk_instance_.options_->log_options.log_stream, debug);
  }
  // Set up the hyper-sparse CHUZC data
  hyper_chuzc_candidate.resize(1 + max_num_hyper_chuzc_candidates);
  hyper_chuzc_measure.resize(1 + max_num_hyper_chuzc_candidates);
  hyper_chuzc_candidate_set.setup(
      max_num_hyper_chuzc_candidates, num_tot,
      ekk_instance_.options_->output_flag,
      ekk_instance_.options_->log_options.log_stream, debug);
}